

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall
glslang::TType::TType
          (TType *this,TBasicType t,TStorageQualifier q,int vs,int mc,int mr,bool isVector)

{
  undefined1 *puVar1;
  int iVar2;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_0093af60;
  *(TBasicType *)&this->field_0x8 =
       (vs & 0xfU) << 8 | t & 0xff | (mc & 0xfU) << 0xc | (mr & 0xfU) << 0x10 |
       (uint)(vs == 1 && isVector) << 0x14 | *(TBasicType *)&this->field_0x8 & 0xf0000000;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  if (vs < 0) {
    __assert_fail("vs >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x617,"glslang::TType::TType(TBasicType, TStorageQualifier, int, int, int, bool)"
                 );
  }
  if (mc < 0) {
    __assert_fail("mc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x618,"glslang::TType::TType(TBasicType, TStorageQualifier, int, int, int, bool)"
                 );
  }
  if (mr < 0) {
    __assert_fail("mr >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x619,"glslang::TType::TType(TBasicType, TStorageQualifier, int, int, int, bool)"
                 );
  }
  this->sampler = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
  (this->qualifier).semanticName = (char *)0x0;
  puVar1 = &(this->qualifier).field_0x8;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xf800001401ff0000;
  TQualifier::clearLayout(&this->qualifier);
  (this->qualifier).spirvStorageClass = -1;
  (this->qualifier).spirvDecorate = (TSpirvDecorate *)0x0;
  *(ulong *)&(this->qualifier).field_0x8 =
       *(ulong *)&(this->qualifier).field_0x8 & 0xe3ffffe7fe00ff80 | (ulong)(q & 0x7f);
  iVar2 = (*this->_vptr_TType[0x1c])(this);
  if (((char)iVar2 != '\0') && ((*(uint *)&this->field_0x8 & 0xf00) != 0)) {
    __assert_fail("!(isMatrix() && vectorSize != 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x61e,"glslang::TType::TType(TBasicType, TStorageQualifier, int, int, int, bool)"
                 );
  }
  return;
}

Assistant:

explicit TType(TBasicType t = EbtVoid, TStorageQualifier q = EvqTemporary, int vs = 1, int mc = 0, int mr = 0,
                   bool isVector = false) :
                            basicType(t), vectorSize(static_cast<uint32_t>(vs) & 0b1111), matrixCols(static_cast<uint32_t>(mc) & 0b1111), matrixRows(static_cast<uint32_t>(mr) & 0b1111), vector1(isVector && vs == 1), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
                            arraySizes(nullptr), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                assert(vs >= 0);
                                assert(mc >= 0);
                                assert(mr >= 0);

                                sampler.clear();
                                qualifier.clear();
                                qualifier.storage = q;
                                assert(!(isMatrix() && vectorSize != 0));  // prevent vectorSize != 0 on matrices
                            }